

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O2

bool server::isPartOf(char *w1,char *w2)

{
  size_t sVar1;
  int i;
  ulong uVar2;
  uint uVar3;
  
  sVar1 = strlen(w1);
  uVar3 = 0;
  for (uVar2 = 0; uVar2 < sVar1; uVar2 = uVar2 + 1) {
    uVar3 = uVar3 + (w1[uVar2] == w2[uVar3]);
  }
  sVar1 = strlen(w2);
  return sVar1 == uVar3;
}

Assistant:

bool isPartOf(char* w1, char* w2)
    {
        int i=0;
        int j=0;
        
        for(int i; i < strlen(w1); i++)
        {
            if(w1[i] == w2[j])
            {
                j++;
            }
        }
        
        if(strlen(w2) == j)
            return true;
        else
            return false;
    }